

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swin_transformer.h
# Opt level: O2

longlong __thiscall
shift_window_transformer::SwinTransformer<float>::parameterCount(SwinTransformer<float> *this)

{
  longlong lVar1;
  longlong lVar2;
  longlong lVar3;
  longlong lVar4;
  longlong lVar5;
  
  lVar1 = StageModule<float>::parameterCount(&this->stage1);
  lVar2 = StageModule<float>::parameterCount(&this->stage2);
  lVar3 = StageModule<float>::parameterCount(&this->stage3);
  lVar4 = StageModule<float>::parameterCount(&this->stage4);
  lVar5 = Linear<float>::parameterCount(&this->linear);
  return lVar5 + lVar4 + lVar3 + lVar2 + lVar1;
}

Assistant:

long long parameterCount() {
            return stage1.parameterCount() + stage2.parameterCount() + stage3.parameterCount() +
                   stage4.parameterCount() + layerNorm.parameterCount() + linear.parameterCount();
        }